

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O2

int test_map2json_array(void)

{
  int iVar1;
  map2json_t *obj;
  char *pcVar2;
  
  obj = map2json_init((char *)0x0);
  map2json_push(obj,"array[0].object1.key1","value1");
  map2json_push(obj,"array[0].object1.key2","2");
  map2json_push(obj,"array[3]","1");
  map2json_push(obj,"array[2]","b");
  map2json_push(obj,"array[1].array2[0]","test");
  map2json_push(obj,"array[1].array2[1]","test2");
  map2json_push(obj,"array[1].array2[x]","2");
  map2json_push(obj,"array[x]","4");
  pcVar2 = map2json_create(obj);
  printf("Expected: \t%s\nActual: \t%s\n\n",
         "{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}"
         ,pcVar2);
  pcVar2 = map2json_create(obj);
  iVar1 = strcmp("{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}"
                 ,pcVar2);
  if (iVar1 == 0) {
    map2json_destroy(obj);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int test_map2json_array() {
	map2json_t *map2jsonObj = map2json_init(NULL);
	map2json_push(map2jsonObj, "array[0].object1.key1", "value1");
	map2json_push(map2jsonObj, "array[0].object1.key2", "2");
	map2json_push(map2jsonObj, "array[3]", "1");
	map2json_push(map2jsonObj, "array[2]", "b");
	map2json_push(map2jsonObj, "array[1].array2[0]", "test");
	map2json_push(map2jsonObj, "array[1].array2[1]", "test2");
	map2json_push(map2jsonObj, "array[1].array2[x]", "2");
	map2json_push(map2jsonObj, "array[x]", "4");

	ASSERTSTR("{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}", map2json_create(map2jsonObj));
	map2json_destroy(map2jsonObj);
	return 0;
}